

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_error.cpp
# Opt level: O3

bool pfederc::logParserErrors(Logger *log,Parser *parser)

{
  Error<pfederc::SyntaxErrorCode> *pEVar1;
  Lexer *lexer;
  Level LVar2;
  pointer puVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  LogMessage msg;
  string local_108;
  string local_e8;
  vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> local_c8;
  Position local_a8;
  LogMessage local_90;
  pointer local_48;
  Logger *local_40;
  Parser *local_38;
  
  puVar3 = (parser->errors).
           super__Vector_base<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_48 = (parser->errors).
             super__Vector_base<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 == local_48) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    local_40 = log;
    local_38 = parser;
    do {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      pEVar1 = (puVar3->_M_t).
               super___uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
               .super__Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>.
               _M_head_impl;
      lexer = local_38->lexer;
      local_a8.line = (pEVar1->pos).line;
      local_a8.startIndex = (pEVar1->pos).startIndex;
      local_a8.endIndex = (pEVar1->pos).endIndex;
      LVar2 = pEVar1->logLevel;
      switch(pEVar1->err) {
      case STX_ERR_EXPECTED_PRIMARY_EXPR:
        local_90._vptr_LogMessage = (_func_int **)0x1b;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xb) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xc) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xd) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xe) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = 'y';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x10) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x11) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x12) = 'x';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x13) = 'p';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x14) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x15) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x16) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x17) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x18) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x19) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1a) = 'n';
        *(undefined8 *)local_108._M_dataplus._M_p = 0x6465746365707845;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 8) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 9) = 'p';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 10) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xb) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xc) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xd) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xe) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = 'y';
        local_108._M_string_length = (size_type)local_90._vptr_LogMessage;
        local_108._M_dataplus._M_p[(long)local_90._vptr_LogMessage] = '\0';
        logCreateErrorMessage(&local_e8,lexer,&local_a8,&local_108);
        local_c8.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c8.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        LogMessage::LogMessage(&local_90,LVar2,&local_e8,&local_c8);
        std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector(&local_c8);
        goto LAB_00112110;
      case STX_ERR_EXPECTED_CLOSING_BRACKET:
        local_108.field_2._8_4_ = 0x27292720;
        goto LAB_00111dfa;
      case STX_ERR_EXPECTED_ARR_CLOSING_BRACKET:
        local_108.field_2._8_4_ = 0x275d2720;
        goto LAB_00111dfa;
      case STX_ERR_EXPECTED_TEMPL_CLOSING_BRACKET:
        local_108.field_2._8_4_ = 0x277d2720;
        goto LAB_00111dfa;
      case STX_ERR_EXPECTED_FUNCTION_ID:
        local_90._vptr_LogMessage = (_func_int **)0x13;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        goto LAB_00111bf0;
      case STX_ERR_EXPECTED_PARAMETERS:
        local_90._vptr_LogMessage = (_func_int **)0x1c;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        builtin_strncpy((char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)local_108._M_dataplus._M_p + 0xc),"ction parameters",0x10);
        uVar6._0_1_ = 'E';
        uVar6._1_1_ = 'x';
        uVar6._2_1_ = 'p';
        uVar6._3_1_ = 'e';
        uVar8._0_1_ = 'c';
        uVar8._1_1_ = 't';
        uVar8._2_1_ = 'e';
        uVar8._3_1_ = 'd';
        uVar10._0_1_ = ' ';
        uVar10._1_1_ = 'f';
        uVar10._2_1_ = 'u';
        uVar10._3_1_ = 'n';
        uVar12._0_1_ = 'c';
        uVar12._1_1_ = 't';
        uVar12._2_1_ = 'i';
        uVar12._3_1_ = 'o';
        goto LAB_00111b0c;
      case STX_ERR_INVALID_VARDECL_ID:
        local_90._vptr_LogMessage = (_func_int **)0x1c;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        builtin_strncpy((char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)local_108._M_dataplus._M_p + 0xc),"iable identifier",0x10);
        uVar6._0_1_ = 'E';
        uVar6._1_1_ = 'x';
        uVar6._2_1_ = 'p';
        uVar6._3_1_ = 'e';
        uVar8._0_1_ = 'c';
        uVar8._1_1_ = 't';
        uVar8._2_1_ = 'e';
        uVar8._3_1_ = 'd';
        uVar10._0_1_ = ' ';
        uVar10._1_1_ = 'v';
        uVar10._2_1_ = 'a';
        uVar10._3_1_ = 'r';
        uVar12._0_1_ = 'i';
        uVar12._1_1_ = 'a';
        uVar12._2_1_ = 'b';
        uVar12._3_1_ = 'l';
        goto LAB_00111b0c;
      case STX_ERR_INVALID_VARDECL:
        local_90._vptr_LogMessage = (_func_int **)0x1c;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        builtin_strncpy((char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)local_108._M_dataplus._M_p + 0xc),"able declaration",0x10);
        uVar6._0_1_ = 'I';
        uVar6._1_1_ = 'n';
        uVar6._2_1_ = 'v';
        uVar6._3_1_ = 'a';
        uVar8._0_1_ = 'l';
        uVar8._1_1_ = 'i';
        uVar8._2_1_ = 'd';
        uVar8._3_1_ = ' ';
        uVar10._0_1_ = 'v';
        uVar10._1_1_ = 'a';
        uVar10._2_1_ = 'r';
        uVar10._3_1_ = 'i';
        uVar12._0_1_ = 'a';
        uVar12._1_1_ = 'b';
        uVar12._2_1_ = 'l';
        uVar12._3_1_ = 'e';
        goto LAB_00111b0c;
      case STX_ERR_EXPECTED_ID:
        local_90._vptr_LogMessage = (_func_int **)0x13;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
LAB_00111bf0:
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        *(undefined8 *)local_108._M_dataplus._M_p = 0x6465746365707845;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 8) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 9) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 10) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xb) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xc) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xd) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xe) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x10) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x11) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x12) = 'r';
        break;
      case STX_ERR_EXPECTED_VARDECL:
        local_90._vptr_LogMessage = (_func_int **)0x1d;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        builtin_strncpy((char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)local_108._M_dataplus._M_p + 0xd),"able declaration",0x10);
        uVar6._0_1_ = 'E';
        uVar6._1_1_ = 'x';
        uVar6._2_1_ = 'p';
        uVar6._3_1_ = 'e';
        uVar8._0_1_ = 'c';
        uVar8._1_1_ = 't';
        uVar8._2_1_ = 'e';
        uVar8._3_1_ = 'd';
        uVar10._0_1_ = ' ';
        uVar10._1_1_ = 'v';
        uVar10._2_1_ = 'a';
        uVar10._3_1_ = 'r';
        uVar12._0_1_ = 'i';
        uVar12._1_1_ = 'a';
        uVar12._2_1_ = 'b';
        uVar12._3_1_ = 'l';
        goto LAB_00111b0c;
      case STX_ERR_EXPECTED_GUARD:
        uVar5 = 0x6472617567206465;
        goto LAB_00111b65;
      case STX_ERR_EXPECTED_FN_DCL_DEF:
        local_90._vptr_LogMessage = (_func_int **)0x32;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x20) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x21) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x22) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x23) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x24) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x25) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x26) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x27) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x28) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x29) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x2a) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x2b) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x2c) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x2d) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x2e) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x2f) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x10) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x11) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x12) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x13) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x14) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x15) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x16) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x17) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x18) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x19) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1a) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1b) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1c) = 'l';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1d) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1e) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1f) = 'a';
        *(undefined8 *)local_108._M_dataplus._M_p = 0x6465746365707845;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 8) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 9) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 10) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xb) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xc) = 'h';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xd) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xe) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x30) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x31) = 'n';
        break;
      case STX_ERR_EXPECTED_STMT:
        local_108.field_2._8_4_ = 0x273b2720;
LAB_00111dfa:
        local_108._M_string_length = 0xc;
        local_108.field_2._M_local_buf[0xc] = '\0';
LAB_00111e06:
        local_108.field_2._M_allocated_capacity._6_2_ = 0x6465;
        local_108.field_2._M_local_buf[5] = 't';
        local_108.field_2._M_allocated_capacity._0_5_ = 0x6365707845;
        logCreateErrorMessage(&local_e8,lexer,&local_a8,&local_108);
        local_c8.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c8.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        LogMessage::LogMessage(&local_90,LVar2,&local_e8,&local_c8);
        std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector(&local_c8);
LAB_00111e4e:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00112130;
      case STX_ERR_FUNC_VAR_NO_TEMPL:
        local_90._vptr_LogMessage = (_func_int **)0x26;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x10) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x11) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x12) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x13) = '\'';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x14) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x15) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x16) = 'h';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x17) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x18) = 'v';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x19) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1a) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1b) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1c) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1d) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1e) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1f) = 'm';
        *(undefined8 *)local_108._M_dataplus._M_p = 0x6e6f6974636e7546;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 8) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 9) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 10) = 'y';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xb) = 'p';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xc) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xd) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xe) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1e) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1f) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x20) = 'p';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x21) = 'l';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x22) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x23) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x24) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x25) = '.';
        break;
      case STX_ERR_FUNC_VAR_NO_CAPS:
        local_90._vptr_LogMessage = (_func_int **)0x28;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x10) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x11) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x12) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x13) = '\'';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x14) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x15) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x16) = 'h';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x17) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x18) = 'v';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x19) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1a) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1b) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1c) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1d) = 'p';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1e) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1f) = 'b';
        *(undefined8 *)local_108._M_dataplus._M_p = 0x6e6f6974636e7546;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 8) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 9) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 10) = 'y';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xb) = 'p';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xc) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xd) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xe) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = 'u';
        uVar5 = 0x2e73656974696c69;
        goto LAB_00111eb8;
      case STX_ERR_EXPECTED_EOL:
        local_90._vptr_LogMessage = (_func_int **)0x14;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        *(undefined8 *)local_108._M_dataplus._M_p = 0x6465746365707845;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 8) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 9) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 10) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xb) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xc) = '-';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xd) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xe) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = '-';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x10) = 'l';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x11) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x12) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x13) = 'e';
        break;
      case STX_ERR_EXPECTED_EOF:
        local_90._vptr_LogMessage = (_func_int **)0x14;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        *(undefined8 *)local_108._M_dataplus._M_p = 0x6465746365707845;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 8) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 9) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 10) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xb) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xc) = '-';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xd) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xe) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = '-';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x10) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x11) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x12) = 'l';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x13) = 'e';
        break;
      case STX_ERR_EXPECTED_EOF_EOL:
        local_90._vptr_LogMessage = (_func_int **)0x23;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x10) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x11) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x12) = 'l';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x13) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x14) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x15) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x16) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x17) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x18) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x19) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1a) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1b) = '-';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1c) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1d) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1e) = '-';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1f) = 'l';
        *(undefined8 *)local_108._M_dataplus._M_p = 0x6465746365707845;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 8) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 9) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 10) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xb) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xc) = '-';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xd) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xe) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = '-';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1f) = 'l';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x20) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x21) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x22) = 'e';
        break;
      case STX_ERR_INVALID_EXPR:
        local_90._vptr_LogMessage = (_func_int **)0x12;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        *(undefined8 *)local_108._M_dataplus._M_p = 0x2064696c61766e49;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 8) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 9) = 'x';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 10) = 'p';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xb) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xc) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xd) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xe) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x10) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x11) = 'n';
        break;
      default:
        local_108.field_2._8_4_ = 0x6f727265;
        local_108.field_2._M_local_buf[0xc] = 'r';
        local_108.field_2._M_allocated_capacity._0_5_ = 0x6f6e6b6e55;
        local_108.field_2._M_local_buf[5] = 'w';
        local_108.field_2._M_allocated_capacity._6_2_ = 0x206e;
        local_108._M_string_length = 0xd;
        local_108.field_2._M_local_buf[0xd] = '\0';
        logCreateErrorMessage(&local_e8,lexer,&local_a8,&local_108);
        local_c8.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_c8.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        LogMessage::LogMessage(&local_90,LVar2,&local_e8,&local_c8);
        std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector(&local_c8);
        goto LAB_00111e4e;
      case STX_ERR_PROGNAME:
        local_90._vptr_LogMessage = (_func_int **)0x15;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        *(undefined8 *)local_108._M_dataplus._M_p = 0x6465746365707845;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 8) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 9) = 'p';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 10) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xb) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xc) = 'g';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xd) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xe) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = 'm';
        uVar5 = 0x656d616e206d6172;
        goto LAB_00111c78;
      case STX_ERR_CLASS_SCOPE:
        local_90._vptr_LogMessage = (_func_int **)0x16;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        *(undefined8 *)local_108._M_dataplus._M_p = 0x2064696c61766e49;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 8) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 9) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 10) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xb) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xc) = 'l';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xd) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xe) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = 's';
        uVar5 = 0x65706f6373207373;
        goto LAB_00112021;
      case STX_ERR_TRAIT_SCOPE:
        local_90._vptr_LogMessage = (_func_int **)0x16;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        *(undefined8 *)local_108._M_dataplus._M_p = 0x2064696c61766e49;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 8) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 9) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 10) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xb) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xc) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xd) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xe) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = 't';
        uVar5 = 0x65706f6373207469;
        goto LAB_00112021;
      case STX_ERR_TRAIT_SCOPE_FUNC_TEMPL:
        local_90._vptr_LogMessage = (_func_int **)0x28;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x10) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x11) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x12) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x13) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x14) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x15) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x16) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x17) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x18) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x19) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1a) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1b) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1c) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1d) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1e) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1f) = 'a';
        *(undefined8 *)local_108._M_dataplus._M_p = 0x2064696c61766e49;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 8) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 9) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 10) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xb) = 'p';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xc) = 'l';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xd) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xe) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = 'e';
        uVar5 = 0x65706f6373207469;
LAB_00111eb8:
        *(undefined8 *)(local_108._M_dataplus._M_p + 0x20) = uVar5;
        break;
      case STX_ERR_TRAIT_SCOPE_FUNC_BODY:
        local_90._vptr_LogMessage = (_func_int **)0x1f;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        builtin_strncpy((char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)local_108._M_dataplus._M_p + 0xf),"y in trait scope",0x10);
        uVar6._0_1_ = 'N';
        uVar6._1_1_ = 'o';
        uVar6._2_1_ = ' ';
        uVar6._3_1_ = 'f';
        uVar8._0_1_ = 'u';
        uVar8._1_1_ = 'n';
        uVar8._2_1_ = 'c';
        uVar8._3_1_ = 't';
        uVar10._0_1_ = 'i';
        uVar10._1_1_ = 'o';
        uVar10._2_1_ = 'n';
        uVar10._3_1_ = ' ';
        uVar12._0_1_ = 'b';
        uVar12._1_1_ = 'o';
        uVar12._2_1_ = 'd';
        uVar12._3_1_ = 'y';
        goto LAB_00111b0c;
      case STX_ERR_TRAITCLASS_SCOPE_FUNC_BODY:
        local_90._vptr_LogMessage = (_func_int **)0x2b;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        builtin_strncpy((char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)local_108._M_dataplus._M_p + 0x10),"n body in class trait scope"
                        ,0x1b);
        uVar7._0_1_ = 'E';
        uVar7._1_1_ = 'x';
        uVar7._2_1_ = 'p';
        uVar7._3_1_ = 'e';
        uVar9._0_1_ = 'c';
        uVar9._1_1_ = 't';
        uVar9._2_1_ = 'e';
        uVar9._3_1_ = 'd';
        uVar11._0_1_ = ' ';
        uVar11._1_1_ = 'f';
        uVar11._2_1_ = 'u';
        uVar11._3_1_ = 'n';
        uVar13._0_1_ = 'c';
        uVar13._1_1_ = 't';
        uVar13._2_1_ = 'i';
        uVar13._3_1_ = 'o';
        goto LAB_001120be;
      case STX_ERR_TRAITCLASS_IMPL:
        local_90._vptr_LogMessage = (_func_int **)0x27;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x10) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x11) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x12) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x13) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x14) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x15) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x16) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x17) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x18) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x19) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1a) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1b) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1c) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1d) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1e) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1f) = 'a';
        *(undefined8 *)local_108._M_dataplus._M_p = 0x6465746365707845;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 8) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 9) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 10) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xb) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xc) = 'g';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xd) = 'l';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xe) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = ' ';
        uVar5 = 0x6570797420746961;
        goto LAB_00111f4c;
      case STX_ERR_ENUM_SCOPE:
        local_90._vptr_LogMessage = (_func_int **)0x15;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        *(undefined8 *)local_108._M_dataplus._M_p = 0x2064696c61766e49;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 8) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 9) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 10) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xb) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xc) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xd) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xe) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = ' ';
        uVar5 = 0x65706f6373206d75;
LAB_00111c78:
        *(undefined8 *)(local_108._M_dataplus._M_p + 0xd) = uVar5;
        break;
      case STX_ERR_ENUM_BODY:
        local_90._vptr_LogMessage = (_func_int **)0x12;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        *(undefined8 *)local_108._M_dataplus._M_p = 0x6465746365707845;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 8) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 9) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 10) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xb) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xc) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xd) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xe) = 'b';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x10) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x11) = 'y';
        break;
      case STX_ERR_CLASS_TRAIT_SCOPE:
        local_90._vptr_LogMessage = (_func_int **)0x1c;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        builtin_strncpy((char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)local_108._M_dataplus._M_p + 0xc),"lass trait scope",0x10);
        uVar6._0_1_ = 'I';
        uVar6._1_1_ = 'n';
        uVar6._2_1_ = 'v';
        uVar6._3_1_ = 'a';
        uVar8._0_1_ = 'l';
        uVar8._1_1_ = 'i';
        uVar8._2_1_ = 'd';
        uVar8._3_1_ = ' ';
        uVar10._0_1_ = 'i';
        uVar10._1_1_ = 'n';
        uVar10._2_1_ = ' ';
        uVar10._3_1_ = 'c';
        uVar12._0_1_ = 'l';
        uVar12._1_1_ = 'a';
        uVar12._2_1_ = 's';
        uVar12._3_1_ = 's';
        goto LAB_00111b0c;
      case STX_ERR_EXPECTED_CONSTRUCTION:
        local_90._vptr_LogMessage = (_func_int **)0x14;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        *(undefined8 *)local_108._M_dataplus._M_p = 0x6465746365707845;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 8) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 9) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 10) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xb) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xc) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xd) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xe) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x10) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x11) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x12) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x13) = 'r';
        break;
      case STX_ERR_INVALID_TYPE_EXPR:
        local_90._vptr_LogMessage = (_func_int **)0x17;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        *(undefined8 *)local_108._M_dataplus._M_p = 0x2064696c61766e49;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 8) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 9) = 'y';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 10) = 'p';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xb) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xc) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xd) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xe) = 'x';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = 'p';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = 'p';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x10) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x11) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x12) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x13) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x14) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x15) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x16) = 'n';
        break;
      case STX_ERR_EXPECTED_FOR:
        uVar5 = 0x27726f6627206465;
LAB_00111b65:
        local_108.field_2._8_4_ = (undefined4)((ulong)uVar5 >> 0x10);
        local_108.field_2._M_local_buf[0xc] = (char)((ulong)uVar5 >> 0x30);
        local_108.field_2._M_local_buf[0xd] = (char)((ulong)uVar5 >> 0x38);
        local_108._M_string_length = 0xe;
        local_108.field_2._M_local_buf[0xe] = '\0';
        goto LAB_00111e06;
      case STX_ERR_EXPECTED_STMT_ELSE:
        local_90._vptr_LogMessage = (_func_int **)0x16;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        *(undefined8 *)local_108._M_dataplus._M_p = 0x6465746365707845;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 8) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 9) = '\'';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 10) = ';';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xb) = '\'';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xc) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xd) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xe) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = ' ';
        uVar5 = 0x2765736c65272072;
LAB_00112021:
        *(undefined8 *)(local_108._M_dataplus._M_p + 0xe) = uVar5;
        break;
      case STX_ERR_EXPECTED_EOL_IF:
        local_90._vptr_LogMessage = (_func_int **)0x23;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x10) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x11) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x12) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x13) = '-';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x14) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x15) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x16) = '-';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x17) = 'l';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x18) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x19) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1a) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1b) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1c) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1d) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1e) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1f) = '\'';
        *(undefined8 *)local_108._M_dataplus._M_p = 0x6465746365707845;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 8) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 9) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 10) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xb) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xc) = 'h';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xd) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xe) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1f) = '\'';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x20) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x21) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x22) = '\'';
        break;
      case STX_ERR_EXPECTED_EOL_ENSURE:
        local_90._vptr_LogMessage = (_func_int **)0x27;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x10) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x11) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x12) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x13) = '-';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x14) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x15) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x16) = '-';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x17) = 'l';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x18) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x19) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1a) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1b) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1c) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1d) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1e) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1f) = '\'';
        *(undefined8 *)local_108._M_dataplus._M_p = 0x6465746365707845;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 8) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 9) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 10) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xb) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xc) = 'h';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xd) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xe) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = ' ';
        uVar5 = 0x27657275736e6527;
LAB_00111f4c:
        *(undefined8 *)(local_108._M_dataplus._M_p + 0x1f) = uVar5;
        break;
      case STX_ERR_EXPECTED_ID_NUM_CHAR_BOOL:
        local_90._vptr_LogMessage = (_func_int **)0x3e;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        builtin_strncpy((char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)local_108._M_dataplus._M_p + 0x10),
                        "identifier, number, character or boolean token",0x2e);
        uVar7._0_1_ = 'E';
        uVar7._1_1_ = 'x';
        uVar7._2_1_ = 'p';
        uVar7._3_1_ = 'e';
        uVar9._0_1_ = 'c';
        uVar9._1_1_ = 't';
        uVar9._2_1_ = 'e';
        uVar9._3_1_ = 'd';
        uVar11._0_1_ = ' ';
        uVar11._1_1_ = 'e';
        uVar11._2_1_ = 'i';
        uVar11._3_1_ = 't';
        uVar13._0_1_ = 'h';
        uVar13._1_1_ = 'e';
        uVar13._2_1_ = 'r';
        uVar13._3_1_ = ' ';
        goto LAB_001120be;
      case STX_ERR_EXPECTED_ID_ANY:
        local_90._vptr_LogMessage = (_func_int **)0x21;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x10) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x11) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x12) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x13) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x14) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x15) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x16) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x17) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x18) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x19) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1a) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1b) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1c) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1d) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1e) = '\'';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0x1f) = '_';
        *(undefined8 *)local_108._M_dataplus._M_p = 0x6465746365707845;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 8) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 9) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 10) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xb) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xc) = 'h';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xd) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xe) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p + 0xf) = ' ';
        local_108._M_dataplus._M_p[0x20] = '\'';
        break;
      case STX_ERR_EXPECTED_OP_IMPL:
        local_108.field_2._8_4_ = 0x3e3d2720;
        local_108.field_2._M_local_buf[0xc] = '\'';
        local_108._M_string_length = 0xd;
        local_108.field_2._M_local_buf[0xd] = '\0';
        goto LAB_00111e06;
      case STX_ERR_INVALID_CAPS_ENSURE:
        local_90._vptr_LogMessage = (_func_int **)0x1c;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        builtin_strncpy((char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)local_108._M_dataplus._M_p + 0xc),"rance capability",0x10);
        uVar6._0_1_ = 'I';
        uVar6._1_1_ = 'n';
        uVar6._2_1_ = 'v';
        uVar6._3_1_ = 'a';
        uVar8._0_1_ = 'l';
        uVar8._1_1_ = 'i';
        uVar8._2_1_ = 'd';
        uVar8._3_1_ = ' ';
        uVar10._0_1_ = 'e';
        uVar10._1_1_ = 'n';
        uVar10._2_1_ = 's';
        uVar10._3_1_ = 'u';
        uVar12._0_1_ = 'r';
        uVar12._1_1_ = 'a';
        uVar12._2_1_ = 'n';
        uVar12._3_1_ = 'c';
        goto LAB_00111b0c;
      case STX_ERR_INVALID_CAPS_DIRECTIVE:
        local_90._vptr_LogMessage = (_func_int **)0x1c;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        builtin_strncpy((char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)local_108._M_dataplus._M_p + 0xc),"ctive capability",0x10);
        uVar6._0_1_ = 'I';
        uVar6._1_1_ = 'n';
        uVar6._2_1_ = 'v';
        uVar6._3_1_ = 'a';
        uVar8._0_1_ = 'l';
        uVar8._1_1_ = 'i';
        uVar8._2_1_ = 'd';
        uVar8._3_1_ = ' ';
        uVar10._0_1_ = 'd';
        uVar10._1_1_ = 'i';
        uVar10._2_1_ = 'r';
        uVar10._3_1_ = 'e';
        uVar12._0_1_ = 'c';
        uVar12._1_1_ = 't';
        uVar12._2_1_ = 'i';
        uVar12._3_1_ = 'v';
LAB_00111b0c:
        *(undefined4 *)local_108._M_dataplus._M_p = uVar6;
        *(undefined4 *)(local_108._M_dataplus._M_p + 4) = uVar8;
        *(undefined4 *)(local_108._M_dataplus._M_p + 8) = uVar10;
        *(undefined4 *)(local_108._M_dataplus._M_p + 0xc) = uVar12;
        break;
      case STX_ERR_INVALID_CAPS_FOLLOWUP:
        local_90._vptr_LogMessage = (_func_int **)0x2c;
        local_108._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_108,(ulong)&local_90);
        local_108.field_2._M_allocated_capacity._0_5_ = SUB85(local_90._vptr_LogMessage,0);
        local_108.field_2._M_local_buf[5] = (char)((ulong)local_90._vptr_LogMessage >> 0x28);
        local_108.field_2._M_allocated_capacity._6_2_ =
             (undefined2)((ulong)local_90._vptr_LogMessage >> 0x30);
        builtin_strncpy((char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)local_108._M_dataplus._M_p + 0x10),
                        "on following capability list",0x1c);
        uVar7._0_1_ = 'I';
        uVar7._1_1_ = 'n';
        uVar7._2_1_ = 'v';
        uVar7._3_1_ = 'a';
        uVar9._0_1_ = 'l';
        uVar9._1_1_ = 'i';
        uVar9._2_1_ = 'd';
        uVar9._3_1_ = ' ';
        uVar11._0_1_ = 'e';
        uVar11._1_1_ = 'x';
        uVar11._2_1_ = 'p';
        uVar11._3_1_ = 'r';
        uVar13._0_1_ = 'e';
        uVar13._1_1_ = 's';
        uVar13._2_1_ = 's';
        uVar13._3_1_ = 'i';
LAB_001120be:
        *(undefined4 *)local_108._M_dataplus._M_p = uVar7;
        *(undefined4 *)(local_108._M_dataplus._M_p + 4) = uVar9;
        *(undefined4 *)(local_108._M_dataplus._M_p + 8) = uVar11;
        *(undefined4 *)(local_108._M_dataplus._M_p + 0xc) = uVar13;
      }
      local_108._M_dataplus._M_p[(long)local_90._vptr_LogMessage] = '\0';
      local_108._M_string_length = (size_type)local_90._vptr_LogMessage;
      logCreateErrorMessage(&local_e8,lexer,&local_a8,&local_108);
      local_c8.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      LogMessage::LogMessage(&local_90,LVar2,&local_e8,&local_c8);
      std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector(&local_c8);
LAB_00112110:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
LAB_00112130:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,
                        CONCAT26(local_108.field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_108.field_2._M_local_buf[5],
                                          local_108.field_2._M_allocated_capacity._0_5_)) + 1);
      }
      LVar2 = LogMessage::getLogLevel(&local_90);
      bVar4 = (bool)(bVar4 | LVar2 == LVL_ERROR);
      LogMessage::log(&local_90,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      LogMessage::~LogMessage(&local_90);
      puVar3 = puVar3 + 1;
    } while (puVar3 != local_48);
  }
  return bVar4;
}

Assistant:

bool pfederc::logParserErrors(Logger &log, const Parser &parser) noexcept {
  bool result = false;
  for (const auto &stxErr : parser.getErrors()) {
    LogMessage msg = _logParserError(parser, *stxErr);
    if (msg.getLogLevel() == LVL_ERROR)
      result = true;
    msg.log(log);
  }

  return result;
}